

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_verify_s256_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,word256 mask_a,
               word256 mask_b,word256 mask_c)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  bool bVar40;
  ulong uVar41;
  ulong uVar42;
  ulong *puVar43;
  long in_RCX;
  ulong *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  uint m_4;
  word256 tmp_2;
  word256 tmp2_2;
  word256 tmp1_2;
  uint j_2;
  uint m_3;
  word256 tmp_1;
  word256 tmp2_1;
  word256 tmp1_1;
  uint j_1;
  uint m_2;
  word256 tmp2;
  word256 tmp1;
  uint j;
  uint m_1;
  word256 tmp;
  uint m;
  word256 x2m [2];
  word256 x1s [2];
  word256 x0s [2];
  word256 r2m [2];
  word256 r1s [2];
  word256 r1m [2];
  word256 r0s [2];
  word256 r0m [2];
  uint local_17c4;
  uint local_1624;
  ulong local_1620 [4];
  undefined8 uStack_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  ulong local_15e0 [4];
  undefined8 uStack_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  ulong local_15a0 [4];
  undefined8 uStack_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  ulong local_1560 [4];
  undefined1 local_1540 [32];
  ulong local_1520;
  ulong uStack_1518;
  ulong uStack_1510;
  ulong uStack_1508;
  ulong uStack_1500;
  ulong uStack_14f8;
  ulong uStack_14f0;
  ulong uStack_14e8;
  ulong auStack_14e0 [4];
  undefined1 local_14c0 [32];
  ulong uStack_14a0;
  ulong uStack_1498;
  ulong uStack_1490;
  ulong uStack_1488;
  ulong uStack_1480;
  ulong uStack_1478;
  ulong uStack_1470;
  ulong uStack_1468;
  ulong local_1460 [4];
  undefined1 local_1440 [32];
  undefined1 (*local_1398) [32];
  undefined1 (*local_1388) [32];
  undefined1 (*local_1378) [32];
  undefined1 (*local_1370) [32];
  undefined1 (*local_1368) [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined4 local_10c4;
  ulong local_10c0;
  ulong uStack_10b8;
  ulong uStack_10b0;
  undefined8 uStack_10a8;
  undefined4 local_1084;
  ulong local_1080;
  ulong uStack_1078;
  ulong uStack_1070;
  undefined8 uStack_1068;
  undefined4 local_1044;
  ulong local_1040;
  ulong uStack_1038;
  ulong uStack_1030;
  ulong uStack_1028;
  undefined4 local_1004;
  ulong local_1000;
  ulong uStack_ff8;
  ulong uStack_ff0;
  ulong uStack_fe8;
  undefined4 local_fc4;
  ulong local_fc0;
  ulong uStack_fb8;
  ulong uStack_fb0;
  ulong uStack_fa8;
  undefined4 local_f84;
  ulong local_f80;
  ulong uStack_f78;
  ulong uStack_f70;
  ulong uStack_f68;
  undefined4 local_f44;
  undefined1 local_f40 [32];
  undefined4 local_f04;
  undefined1 local_f00 [32];
  undefined4 local_ec4;
  undefined1 local_ec0 [32];
  undefined4 local_e84;
  undefined1 local_e80 [32];
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  ulong local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  ulong local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  ulong local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  ulong local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined1 local_d40 [32];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  ulong local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  ulong local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  ulong local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  ulong local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  ulong local_c40;
  ulong uStack_c38;
  ulong uStack_c30;
  ulong uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  ulong local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  ulong local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  ulong local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  ulong local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined4 local_8c4;
  ulong local_8c0;
  ulong uStack_8b8;
  ulong uStack_8b0;
  undefined8 uStack_8a8;
  undefined4 local_884;
  ulong local_880;
  ulong uStack_878;
  ulong uStack_870;
  undefined8 uStack_868;
  undefined4 local_844;
  ulong local_840;
  ulong uStack_838;
  ulong uStack_830;
  ulong uStack_828;
  undefined4 local_804;
  ulong local_800;
  ulong uStack_7f8;
  ulong uStack_7f0;
  ulong uStack_7e8;
  undefined4 local_7c4;
  ulong local_7c0;
  ulong uStack_7b8;
  ulong uStack_7b0;
  ulong uStack_7a8;
  undefined4 local_784;
  ulong local_780;
  ulong uStack_778;
  ulong uStack_770;
  ulong uStack_768;
  undefined4 local_744;
  undefined1 local_740 [32];
  undefined4 local_704;
  undefined1 local_700 [32];
  undefined4 local_6c4;
  undefined1 local_6c0 [32];
  undefined4 local_684;
  undefined1 local_680 [32];
  ulong local_660;
  ulong uStack_658;
  ulong uStack_650;
  ulong uStack_648;
  ulong local_640;
  ulong uStack_638;
  ulong uStack_630;
  ulong uStack_628;
  ulong local_620;
  ulong uStack_618;
  ulong uStack_610;
  ulong uStack_608;
  ulong local_600;
  ulong uStack_5f8;
  ulong uStack_5f0;
  ulong uStack_5e8;
  ulong local_5e0;
  ulong uStack_5d8;
  ulong uStack_5d0;
  ulong uStack_5c8;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong uStack_5b0;
  ulong uStack_5a8;
  ulong local_5a0;
  ulong uStack_598;
  ulong uStack_590;
  ulong uStack_588;
  ulong local_580;
  ulong uStack_578;
  ulong uStack_570;
  ulong uStack_568;
  ulong local_560;
  ulong uStack_558;
  ulong uStack_550;
  ulong uStack_548;
  ulong local_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  ulong local_520;
  ulong uStack_518;
  ulong uStack_510;
  ulong uStack_508;
  ulong local_500;
  ulong uStack_4f8;
  ulong uStack_4f0;
  ulong uStack_4e8;
  ulong local_4e0;
  ulong uStack_4d8;
  ulong uStack_4d0;
  ulong uStack_4c8;
  ulong local_4c0;
  ulong uStack_4b8;
  ulong uStack_4b0;
  ulong uStack_4a8;
  ulong local_4a0;
  ulong uStack_498;
  ulong uStack_490;
  ulong uStack_488;
  undefined1 local_480 [32];
  ulong local_460;
  ulong uStack_458;
  ulong uStack_450;
  ulong local_420;
  ulong uStack_418;
  ulong uStack_410;
  ulong uStack_408;
  ulong local_3a0;
  ulong uStack_398;
  ulong uStack_390;
  ulong uStack_388;
  ulong local_380;
  ulong uStack_378;
  ulong uStack_370;
  ulong uStack_368;
  ulong local_340;
  ulong uStack_338;
  ulong uStack_330;
  ulong uStack_328;
  ulong local_2e0;
  ulong uStack_2d8;
  ulong uStack_2d0;
  ulong uStack_2c8;
  ulong local_260;
  ulong uStack_258;
  ulong uStack_250;
  ulong uStack_248;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  ulong local_1e0;
  ulong uStack_1d8;
  ulong uStack_1d0;
  ulong uStack_1c8;
  ulong local_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong local_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  
  for (local_1624 = 0; local_1624 < 2; local_1624 = local_1624 + 1) {
    local_1368 = (undefined1 (*) [32])(in_RSI + (ulong)local_1624 * 0x20);
    local_900 = *(undefined8 *)*local_1368;
    uStack_8f8 = *(undefined8 *)(*local_1368 + 8);
    uStack_8f0 = *(undefined8 *)(*local_1368 + 0x10);
    uStack_8e8 = *(undefined8 *)(*local_1368 + 0x18);
    auVar3 = *local_1368;
    auVar5 = *local_1368;
    auVar1 = *local_1368;
    auVar15._8_8_ = in_XMM0_Qb;
    auVar15._0_8_ = in_XMM0_Qa;
    auVar15._16_8_ = in_YMM0_H;
    auVar15._24_8_ = in_register_00001218;
    local_e80 = vpand_avx2(*local_1368,auVar15);
    local_e84 = 2;
    local_1100 = vpsllq_avx2(local_e80,ZEXT416(2));
    local_940 = local_900;
    uStack_938 = uStack_8f8;
    uStack_930 = uStack_8f0;
    uStack_928 = uStack_8e8;
    auVar14._8_8_ = in_XMM0_Qb;
    auVar14._0_8_ = in_XMM0_Qa;
    auVar14._16_8_ = in_YMM0_H;
    auVar14._24_8_ = in_register_00001218;
    local_680 = vpand_avx2(*local_1368,auVar14);
    local_684 = 0x3e;
    auVar2 = vpsrlq_avx2(local_680,ZEXT416(0x3e));
    local_1120 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_1100,local_1120);
    *(undefined1 (*) [32])(local_15a0 + (ulong)local_1624 * 4) = auVar2;
    local_980 = local_900;
    uStack_978 = uStack_8f8;
    uStack_970 = uStack_8f0;
    uStack_968 = uStack_8e8;
    auVar13._8_8_ = in_XMM1_Qb;
    auVar13._0_8_ = in_XMM1_Qa;
    auVar13._16_8_ = in_YMM1_H;
    auVar13._24_8_ = in_register_00001258;
    local_ec0 = vpand_avx2(auVar1,auVar13);
    local_ec4 = 1;
    local_1140 = vpsllq_avx2(local_ec0,ZEXT416(1));
    local_9c0 = local_900;
    uStack_9b8 = uStack_8f8;
    uStack_9b0 = uStack_8f0;
    uStack_9a8 = uStack_8e8;
    auVar12._8_8_ = in_XMM1_Qb;
    auVar12._0_8_ = in_XMM1_Qa;
    auVar12._16_8_ = in_YMM1_H;
    auVar12._24_8_ = in_register_00001258;
    local_6c0 = vpand_avx2(auVar5,auVar12);
    local_6c4 = 0x3f;
    auVar2 = vpsrlq_avx2(local_6c0,ZEXT416(0x3f));
    local_1160 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_1140,local_1160);
    *(undefined1 (*) [32])(local_15e0 + (ulong)local_1624 * 4) = auVar2;
    local_a00 = local_900;
    uStack_9f8 = uStack_8f8;
    uStack_9f0 = uStack_8f0;
    uStack_9e8 = uStack_8e8;
    auVar11._8_8_ = in_XMM2_Qb;
    auVar11._0_8_ = in_XMM2_Qa;
    auVar11._16_8_ = in_YMM2_H;
    auVar11._24_8_ = in_register_00001298;
    auVar2 = vpand_avx2(auVar3,auVar11);
    *(undefined1 (*) [32])(local_1620 + (ulong)local_1624 * 4) = auVar2;
    local_1370 = (undefined1 (*) [32])(in_RCX + (ulong)local_1624 * 0x20);
    local_a40 = *(undefined8 *)*local_1370;
    uStack_a38 = *(undefined8 *)(*local_1370 + 8);
    uStack_a30 = *(undefined8 *)(*local_1370 + 0x10);
    uStack_a28 = *(undefined8 *)(*local_1370 + 0x18);
    auVar3 = *local_1370;
    auVar5 = *local_1370;
    auVar1 = *local_1370;
    auVar10._8_8_ = in_XMM0_Qb;
    auVar10._0_8_ = in_XMM0_Qa;
    auVar10._16_8_ = in_YMM0_H;
    auVar10._24_8_ = in_register_00001218;
    local_f00 = vpand_avx2(*local_1370,auVar10);
    local_f04 = 2;
    local_1180 = vpsllq_avx2(local_f00,ZEXT416(2));
    local_a80 = local_a40;
    uStack_a78 = uStack_a38;
    uStack_a70 = uStack_a30;
    uStack_a68 = uStack_a28;
    auVar9._8_8_ = in_XMM0_Qb;
    auVar9._0_8_ = in_XMM0_Qa;
    auVar9._16_8_ = in_YMM0_H;
    auVar9._24_8_ = in_register_00001218;
    local_700 = vpand_avx2(*local_1370,auVar9);
    local_704 = 0x3e;
    auVar2 = vpsrlq_avx2(local_700,ZEXT416(0x3e));
    local_11a0 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_1180,local_11a0);
    *(undefined1 (*) [32])(&uStack_14a0 + (ulong)local_1624 * 4) = auVar2;
    local_ac0 = local_a40;
    uStack_ab8 = uStack_a38;
    uStack_ab0 = uStack_a30;
    uStack_aa8 = uStack_a28;
    auVar8._8_8_ = in_XMM1_Qb;
    auVar8._0_8_ = in_XMM1_Qa;
    auVar8._16_8_ = in_YMM1_H;
    auVar8._24_8_ = in_register_00001258;
    local_f40 = vpand_avx2(auVar1,auVar8);
    local_f44 = 1;
    local_11c0 = vpsllq_avx2(local_f40,ZEXT416(1));
    local_b00 = local_a40;
    uStack_af8 = uStack_a38;
    uStack_af0 = uStack_a30;
    uStack_ae8 = uStack_a28;
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = in_XMM1_Qa;
    auVar7._16_8_ = in_YMM1_H;
    auVar7._24_8_ = in_register_00001258;
    local_740 = vpand_avx2(auVar5,auVar7);
    local_744 = 0x3f;
    auVar2 = vpsrlq_avx2(local_740,ZEXT416(0x3f));
    local_11e0 = vpermq_avx2(auVar2,0x93);
    auVar2 = vpor_avx2(local_11c0,local_11e0);
    *(undefined1 (*) [32])(&local_1520 + (ulong)local_1624 * 4) = auVar2;
    local_b40 = local_a40;
    uStack_b38 = uStack_a38;
    uStack_b30 = uStack_a30;
    uStack_b28 = uStack_a28;
    auVar6._8_8_ = in_XMM2_Qb;
    auVar6._0_8_ = in_XMM2_Qa;
    auVar6._16_8_ = in_YMM2_H;
    auVar6._24_8_ = in_register_00001298;
    auVar2 = vpand_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])(local_1560 + (ulong)local_1624 * 4) = auVar2;
  }
  bVar40 = false;
  while (!bVar40) {
    auVar30._8_8_ = local_15a0[1];
    auVar30._0_8_ = local_15a0[0];
    auVar30._16_8_ = local_15a0[2];
    auVar30._24_8_ = local_15a0[3];
    auVar24._8_8_ = local_15e0[1];
    auVar24._0_8_ = local_15e0[0];
    auVar24._16_8_ = local_15e0[2];
    auVar24._24_8_ = local_15e0[3];
    local_b80 = local_15a0[0];
    uStack_b78 = local_15a0[1];
    uStack_b70 = local_15a0[2];
    uStack_b68 = local_15a0[3];
    local_ba0 = local_15e0[0];
    uStack_b98 = local_15e0[1];
    uStack_b90 = local_15e0[2];
    uStack_b88 = local_15e0[3];
    auVar2 = vpand_avx2(auVar30,auVar24);
    auVar34._8_8_ = uStack_1578;
    auVar34._0_8_ = uStack_1580;
    auVar34._16_8_ = uStack_1570;
    auVar34._24_8_ = uStack_1568;
    auVar25._8_8_ = local_15e0[1];
    auVar25._0_8_ = local_15e0[0];
    auVar25._16_8_ = local_15e0[2];
    auVar25._24_8_ = local_15e0[3];
    local_bc0 = uStack_1580;
    uStack_bb8 = uStack_1578;
    uStack_bb0 = uStack_1570;
    uStack_ba8 = uStack_1568;
    local_be0 = local_15e0[0];
    uStack_bd8 = local_15e0[1];
    uStack_bd0 = local_15e0[2];
    uStack_bc8 = local_15e0[3];
    auVar1 = vpand_avx2(auVar34,auVar25);
    local_140 = auVar2._0_8_;
    uStack_138 = auVar2._8_8_;
    uStack_130 = auVar2._16_8_;
    uStack_128 = auVar2._24_8_;
    local_160 = auVar1._0_8_;
    uStack_158 = auVar1._8_8_;
    uStack_150 = auVar1._16_8_;
    uStack_148 = auVar1._24_8_;
    auVar31._8_8_ = local_15a0[1];
    auVar31._0_8_ = local_15a0[0];
    auVar31._16_8_ = local_15a0[2];
    auVar31._24_8_ = local_15a0[3];
    auVar28._8_8_ = uStack_15b8;
    auVar28._0_8_ = uStack_15c0;
    auVar28._16_8_ = uStack_15b0;
    auVar28._24_8_ = uStack_15a8;
    local_c00 = local_15a0[0];
    uStack_bf8 = local_15a0[1];
    uStack_bf0 = local_15a0[2];
    uStack_be8 = local_15a0[3];
    local_c20 = uStack_15c0;
    uStack_c18 = uStack_15b8;
    uStack_c10 = uStack_15b0;
    uStack_c08 = uStack_15a8;
    auVar2 = vpand_avx2(auVar31,auVar28);
    local_1e0 = auVar2._0_8_;
    uStack_1d8 = auVar2._8_8_;
    uStack_1d0 = auVar2._16_8_;
    uStack_1c8 = auVar2._24_8_;
    local_1460[0] = local_140 ^ local_160 ^ local_1560[0] ^ local_1540._0_8_ ^ local_1e0;
    local_1460[1] = uStack_138 ^ uStack_158 ^ local_1560[1] ^ local_1540._8_8_ ^ uStack_1d8;
    local_1460[2] = uStack_130 ^ uStack_150 ^ local_1560[2] ^ local_1540._16_8_ ^ uStack_1d0;
    local_1460[3] = uStack_128 ^ uStack_148 ^ local_1560[3] ^ local_1540._24_8_ ^ uStack_1c8;
    *in_RDX = local_1460[0];
    in_RDX[1] = local_1460[1];
    in_RDX[2] = local_1460[2];
    in_RDX[3] = local_1460[3];
    bVar40 = true;
  }
  local_1378 = (undefined1 (*) [32])(in_RDX + 4);
  local_c40 = *(ulong *)*local_1378;
  uStack_c38 = in_RDX[5];
  uStack_c30 = in_RDX[6];
  uStack_c28 = in_RDX[7];
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar2._16_8_ = in_YMM2_H;
  auVar2._24_8_ = in_register_00001298;
  local_1440 = vpand_avx2(*local_1378,auVar2);
  bVar40 = false;
  while (!bVar40) {
    auVar26._8_8_ = local_15e0[1];
    auVar26._0_8_ = local_15e0[0];
    auVar26._16_8_ = local_15e0[2];
    auVar26._24_8_ = local_15e0[3];
    auVar18._8_8_ = local_1620[1];
    auVar18._0_8_ = local_1620[0];
    auVar18._16_8_ = local_1620[2];
    auVar18._24_8_ = local_1620[3];
    local_c80 = local_15e0[0];
    uStack_c78 = local_15e0[1];
    uStack_c70 = local_15e0[2];
    uStack_c68 = local_15e0[3];
    local_ca0 = local_1620[0];
    uStack_c98 = local_1620[1];
    uStack_c90 = local_1620[2];
    uStack_c88 = local_1620[3];
    auVar2 = vpand_avx2(auVar26,auVar18);
    auVar29._8_8_ = uStack_15b8;
    auVar29._0_8_ = uStack_15c0;
    auVar29._16_8_ = uStack_15b0;
    auVar29._24_8_ = uStack_15a8;
    auVar19._8_8_ = local_1620[1];
    auVar19._0_8_ = local_1620[0];
    auVar19._16_8_ = local_1620[2];
    auVar19._24_8_ = local_1620[3];
    local_cc0 = uStack_15c0;
    uStack_cb8 = uStack_15b8;
    uStack_cb0 = uStack_15b0;
    uStack_ca8 = uStack_15a8;
    local_ce0 = local_1620[0];
    uStack_cd8 = local_1620[1];
    uStack_cd0 = local_1620[2];
    uStack_cc8 = local_1620[3];
    auVar1 = vpand_avx2(auVar29,auVar19);
    local_240 = auVar2._0_8_;
    uStack_238 = auVar2._8_8_;
    uStack_230 = auVar2._16_8_;
    uStack_228 = auVar2._24_8_;
    local_260 = auVar1._0_8_;
    uStack_258 = auVar1._8_8_;
    uStack_250 = auVar1._16_8_;
    uStack_248 = auVar1._24_8_;
    auVar27._8_8_ = local_15e0[1];
    auVar27._0_8_ = local_15e0[0];
    auVar27._16_8_ = local_15e0[2];
    auVar27._24_8_ = local_15e0[3];
    auVar22._8_8_ = uStack_15f8;
    auVar22._0_8_ = uStack_1600;
    auVar22._16_8_ = uStack_15f0;
    auVar22._24_8_ = uStack_15e8;
    local_d00 = local_15e0[0];
    uStack_cf8 = local_15e0[1];
    uStack_cf0 = local_15e0[2];
    uStack_ce8 = local_15e0[3];
    local_d20 = uStack_1600;
    uStack_d18 = uStack_15f8;
    uStack_d10 = uStack_15f0;
    uStack_d08 = uStack_15e8;
    auVar2 = vpand_avx2(auVar27,auVar22);
    local_2e0 = auVar2._0_8_;
    uStack_2d8 = auVar2._8_8_;
    uStack_2d0 = auVar2._16_8_;
    uStack_2c8 = auVar2._24_8_;
    local_1560[0] = local_240 ^ local_260 ^ local_1520 ^ uStack_1500 ^ local_2e0;
    local_1560[1] = uStack_238 ^ uStack_258 ^ uStack_1518 ^ uStack_14f8 ^ uStack_2d8;
    local_1560[2] = uStack_230 ^ uStack_250 ^ uStack_1510 ^ uStack_14f0 ^ uStack_2d0;
    local_1560[3] = uStack_228 ^ uStack_248 ^ uStack_1508 ^ uStack_14e8 ^ uStack_2c8;
    auVar36._8_8_ = local_1560[1];
    auVar36._0_8_ = local_1560[0];
    auVar36._16_8_ = local_1560[2];
    auVar36._24_8_ = local_1560[3];
    local_780 = local_1560[0];
    uStack_778 = local_1560[1];
    uStack_770 = local_1560[2];
    uStack_768 = local_1560[3];
    local_784 = 1;
    local_1200 = vpsrlq_avx2(auVar36,ZEXT416(1));
    auVar37._8_8_ = local_1560[1];
    auVar37._0_8_ = local_1560[0];
    auVar37._16_8_ = local_1560[2];
    auVar37._24_8_ = local_1560[3];
    local_f80 = local_1560[0];
    uStack_f78 = local_1560[1];
    uStack_f70 = local_1560[2];
    uStack_f68 = local_1560[3];
    local_f84 = 0x3f;
    auVar2 = vpsllq_avx2(auVar37,ZEXT416(0x3f));
    local_1220 = vpermq_avx2(auVar2,0x39);
    auVar2 = vpor_avx2(local_1200,local_1220);
    local_340 = auVar2._0_8_;
    uStack_338 = auVar2._8_8_;
    uStack_330 = auVar2._16_8_;
    uStack_328 = auVar2._24_8_;
    *in_RDX = local_340 ^ *in_RDX;
    in_RDX[1] = uStack_338 ^ in_RDX[1];
    in_RDX[2] = uStack_330 ^ in_RDX[2];
    in_RDX[3] = uStack_328 ^ in_RDX[3];
    bVar40 = true;
  }
  local_1388 = (undefined1 (*) [32])(in_RDX + 4);
  local_fc0 = *(ulong *)*local_1388;
  uStack_fb8 = in_RDX[5];
  uStack_fb0 = in_RDX[6];
  uStack_fa8 = in_RDX[7];
  local_fc4 = 1;
  local_1240 = vpsllq_avx2(*local_1388,ZEXT416(1));
  local_7c0 = *(ulong *)*local_1388;
  uStack_7b8 = in_RDX[5];
  uStack_7b0 = in_RDX[6];
  uStack_7a8 = in_RDX[7];
  local_7c4 = 0x3f;
  auVar2 = vpsrlq_avx2(*local_1388,ZEXT416(0x3f));
  local_1260 = vpermq_avx2(auVar2,0x93);
  local_d40 = vpor_avx2(local_1240,local_1260);
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = in_XMM2_Qa;
  auVar1._16_8_ = in_YMM2_H;
  auVar1._24_8_ = in_register_00001298;
  local_1540 = vpand_avx2(local_d40,auVar1);
  bVar40 = false;
  while (!bVar40) {
    auVar32._8_8_ = local_15a0[1];
    auVar32._0_8_ = local_15a0[0];
    auVar32._16_8_ = local_15a0[2];
    auVar32._24_8_ = local_15a0[3];
    auVar20._8_8_ = local_1620[1];
    auVar20._0_8_ = local_1620[0];
    auVar20._16_8_ = local_1620[2];
    auVar20._24_8_ = local_1620[3];
    local_d80 = local_15a0[0];
    uStack_d78 = local_15a0[1];
    uStack_d70 = local_15a0[2];
    uStack_d68 = local_15a0[3];
    local_da0 = local_1620[0];
    uStack_d98 = local_1620[1];
    uStack_d90 = local_1620[2];
    uStack_d88 = local_1620[3];
    auVar2 = vpand_avx2(auVar32,auVar20);
    auVar35._8_8_ = uStack_1578;
    auVar35._0_8_ = uStack_1580;
    auVar35._16_8_ = uStack_1570;
    auVar35._24_8_ = uStack_1568;
    auVar21._8_8_ = local_1620[1];
    auVar21._0_8_ = local_1620[0];
    auVar21._16_8_ = local_1620[2];
    auVar21._24_8_ = local_1620[3];
    local_dc0 = uStack_1580;
    uStack_db8 = uStack_1578;
    uStack_db0 = uStack_1570;
    uStack_da8 = uStack_1568;
    local_de0 = local_1620[0];
    uStack_dd8 = local_1620[1];
    uStack_dd0 = local_1620[2];
    uStack_dc8 = local_1620[3];
    auVar1 = vpand_avx2(auVar35,auVar21);
    local_380 = auVar2._0_8_;
    uStack_378 = auVar2._8_8_;
    uStack_370 = auVar2._16_8_;
    uStack_368 = auVar2._24_8_;
    local_3a0 = auVar1._0_8_;
    uStack_398 = auVar1._8_8_;
    uStack_390 = auVar1._16_8_;
    uStack_388 = auVar1._24_8_;
    auVar33._8_8_ = local_15a0[1];
    auVar33._0_8_ = local_15a0[0];
    auVar33._16_8_ = local_15a0[2];
    auVar33._24_8_ = local_15a0[3];
    auVar23._8_8_ = uStack_15f8;
    auVar23._0_8_ = uStack_1600;
    auVar23._16_8_ = uStack_15f0;
    auVar23._24_8_ = uStack_15e8;
    local_e00 = local_15a0[0];
    uStack_df8 = local_15a0[1];
    uStack_df0 = local_15a0[2];
    uStack_de8 = local_15a0[3];
    local_e20 = uStack_1600;
    uStack_e18 = uStack_15f8;
    uStack_e10 = uStack_15f0;
    uStack_e08 = uStack_15e8;
    auVar2 = vpand_avx2(auVar33,auVar23);
    local_420 = auVar2._0_8_;
    uStack_418 = auVar2._8_8_;
    uStack_410 = auVar2._16_8_;
    uStack_408 = auVar2._24_8_;
    local_460 = uStack_14a0 ^ uStack_1480 ^ local_420;
    uStack_458 = uStack_1498 ^ uStack_1478 ^ uStack_418;
    uStack_450 = uStack_1490 ^ uStack_1470 ^ uStack_410;
    auStack_14e0[0] = local_380 ^ local_3a0 ^ local_460;
    auStack_14e0[1] = uStack_378 ^ uStack_398 ^ uStack_458;
    auStack_14e0[2] = uStack_370 ^ uStack_390 ^ uStack_450;
    auStack_14e0[3] = uStack_368 ^ uStack_388 ^ uStack_1488 ^ uStack_1468 ^ uStack_408;
    auVar38._8_8_ = auStack_14e0[1];
    auVar38._0_8_ = auStack_14e0[0];
    auVar38._16_8_ = auStack_14e0[2];
    auVar38._24_8_ = auStack_14e0[3];
    local_800 = auStack_14e0[0];
    uStack_7f8 = auStack_14e0[1];
    uStack_7f0 = auStack_14e0[2];
    uStack_7e8 = auStack_14e0[3];
    local_804 = 2;
    local_1280 = vpsrlq_avx2(auVar38,ZEXT416(2));
    auVar39._8_8_ = auStack_14e0[1];
    auVar39._0_8_ = auStack_14e0[0];
    auVar39._16_8_ = auStack_14e0[2];
    auVar39._24_8_ = auStack_14e0[3];
    local_1000 = auStack_14e0[0];
    uStack_ff8 = auStack_14e0[1];
    uStack_ff0 = auStack_14e0[2];
    uStack_fe8 = auStack_14e0[3];
    local_1004 = 0x3e;
    auVar2 = vpsllq_avx2(auVar39,ZEXT416(0x3e));
    local_12a0 = vpermq_avx2(auVar2,0x39);
    local_480 = vpor_avx2(local_1280,local_12a0);
    local_4a0 = *in_RDX;
    uStack_498 = in_RDX[1];
    uStack_490 = in_RDX[2];
    uStack_488 = in_RDX[3];
    *in_RDX = local_480._0_8_ ^ *in_RDX;
    in_RDX[1] = local_480._8_8_ ^ in_RDX[1];
    in_RDX[2] = local_480._16_8_ ^ in_RDX[2];
    in_RDX[3] = local_480._24_8_ ^ in_RDX[3];
    bVar40 = true;
  }
  local_1398 = (undefined1 (*) [32])(in_RDX + 4);
  local_1040 = *(ulong *)*local_1398;
  uStack_1038 = in_RDX[5];
  uStack_1030 = in_RDX[6];
  uStack_1028 = in_RDX[7];
  local_1044 = 2;
  local_12c0 = vpsllq_avx2(*local_1398,ZEXT416(2));
  local_840 = *(ulong *)*local_1398;
  uStack_838 = in_RDX[5];
  uStack_830 = in_RDX[6];
  uStack_828 = in_RDX[7];
  local_844 = 0x3e;
  auVar2 = vpsrlq_avx2(*local_1398,ZEXT416(0x3e));
  local_12e0 = vpermq_avx2(auVar2,0x93);
  local_e40 = vpor_avx2(local_12c0,local_12e0);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  auVar5._16_8_ = in_YMM2_H;
  auVar5._24_8_ = in_register_00001298;
  local_14c0 = vpand_avx2(local_e40,auVar5);
  for (local_17c4 = 0; local_17c4 < 2; local_17c4 = local_17c4 + 1) {
    uVar41 = (ulong)local_17c4;
    uStack_4b8 = local_1560[uVar41 * 4 + 1];
    uStack_4b0 = local_1560[uVar41 * 4 + 2];
    uStack_4a8 = *(ulong *)(local_1540 + uVar41 * 0x20 + -8);
    uStack_4d8 = local_15a0[uVar41 * 4 + 1];
    uStack_4d0 = local_15a0[uVar41 * 4 + 2];
    uStack_4c8 = local_15a0[uVar41 * 4 + 3];
    local_4c0 = local_1560[uVar41 * 4];
    local_4e0 = local_15a0[uVar41 * 4];
    uVar42 = (ulong)local_17c4;
    local_1560[uVar42 * 4] = local_1560[uVar41 * 4] ^ local_15a0[uVar41 * 4];
    local_1560[uVar42 * 4 + 1] = uStack_4b8 ^ uStack_4d8;
    local_1560[uVar42 * 4 + 2] = uStack_4b0 ^ uStack_4d0;
    *(ulong *)(local_1540 + uVar42 * 0x20 + -8) = uStack_4a8 ^ uStack_4c8;
    uVar41 = (ulong)local_17c4;
    uStack_4f8 = local_15a0[uVar41 * 4 + 1];
    uStack_4f0 = local_15a0[uVar41 * 4 + 2];
    uStack_4e8 = local_15a0[uVar41 * 4 + 3];
    uStack_518 = local_15e0[uVar41 * 4 + 1];
    uStack_510 = local_15e0[uVar41 * 4 + 2];
    uStack_508 = local_15e0[uVar41 * 4 + 3];
    local_500 = local_15a0[uVar41 * 4];
    local_520 = local_15e0[uVar41 * 4];
    uVar42 = (ulong)local_17c4;
    local_15a0[uVar42 * 4] = local_15a0[uVar41 * 4] ^ local_15e0[uVar41 * 4];
    local_15a0[uVar42 * 4 + 1] = uStack_4f8 ^ uStack_518;
    local_15a0[uVar42 * 4 + 2] = uStack_4f0 ^ uStack_510;
    local_15a0[uVar42 * 4 + 3] = uStack_4e8 ^ uStack_508;
    uVar41 = (ulong)local_17c4;
    uStack_538 = local_15a0[uVar41 * 4 + 1];
    uStack_530 = local_15a0[uVar41 * 4 + 2];
    uStack_528 = local_15a0[uVar41 * 4 + 3];
    uStack_558 = auStack_14e0[uVar41 * 4 + 1];
    uStack_550 = auStack_14e0[uVar41 * 4 + 2];
    uStack_548 = *(ulong *)(local_14c0 + uVar41 * 0x20 + -8);
    local_540 = local_15a0[uVar41 * 4];
    local_560 = auStack_14e0[uVar41 * 4];
    uVar42 = (ulong)local_17c4;
    auStack_14e0[uVar42 * 4] = local_15a0[uVar41 * 4] ^ auStack_14e0[uVar41 * 4];
    auStack_14e0[uVar42 * 4 + 1] = uStack_538 ^ uStack_558;
    auStack_14e0[uVar42 * 4 + 2] = uStack_530 ^ uStack_550;
    *(ulong *)(local_14c0 + uVar42 * 0x20 + -8) = uStack_528 ^ uStack_548;
    uVar41 = (ulong)local_17c4;
    uStack_578 = local_15a0[uVar41 * 4 + 1];
    uStack_570 = local_15a0[uVar41 * 4 + 2];
    uStack_568 = local_15a0[uVar41 * 4 + 3];
    uStack_598 = local_1460[uVar41 * 4 + 1];
    uStack_590 = local_1460[uVar41 * 4 + 2];
    uStack_588 = *(ulong *)(local_1440 + uVar41 * 0x20 + -8);
    local_580 = local_15a0[uVar41 * 4];
    local_5a0 = local_1460[uVar41 * 4];
    uVar42 = (ulong)local_17c4;
    local_1460[uVar42 * 4] = local_15a0[uVar41 * 4] ^ local_1460[uVar41 * 4];
    local_1460[uVar42 * 4 + 1] = uStack_578 ^ uStack_598;
    local_1460[uVar42 * 4 + 2] = uStack_570 ^ uStack_590;
    *(ulong *)(local_1440 + uVar42 * 0x20 + -8) = uStack_568 ^ uStack_588;
    uVar41 = (ulong)local_17c4;
    local_880 = local_1560[uVar41 * 4];
    uStack_878 = local_1560[uVar41 * 4 + 1];
    uStack_870 = local_1560[uVar41 * 4 + 2];
    uStack_868 = *(undefined8 *)(local_1540 + uVar41 * 0x20 + -8);
    local_884 = 2;
    auVar17._8_8_ = local_1560[uVar41 * 4 + 1];
    auVar17._0_8_ = local_1560[uVar41 * 4];
    auVar17._16_8_ = local_1560[uVar41 * 4 + 2];
    auVar17._24_8_ = *(undefined8 *)(local_1540 + uVar41 * 0x20 + -8);
    local_1300 = vpsrlq_avx2(auVar17,ZEXT416(2));
    uVar41 = (ulong)local_17c4;
    local_1080 = local_1560[uVar41 * 4];
    uStack_1078 = local_1560[uVar41 * 4 + 1];
    uStack_1070 = local_1560[uVar41 * 4 + 2];
    uStack_1068 = *(undefined8 *)(local_1540 + uVar41 * 0x20 + -8);
    local_1084 = 0x3e;
    auVar4._8_8_ = local_1560[uVar41 * 4 + 1];
    auVar4._0_8_ = local_1560[uVar41 * 4];
    auVar4._16_8_ = local_1560[uVar41 * 4 + 2];
    auVar4._24_8_ = *(undefined8 *)(local_1540 + uVar41 * 0x20 + -8);
    auVar2 = vpsllq_avx2(auVar4,ZEXT416(0x3e));
    local_1320 = vpermq_avx2(auVar2,0x39);
    auVar2 = vpor_avx2(local_1300,local_1320);
    *(undefined1 (*) [32])(local_15a0 + (ulong)local_17c4 * 4) = auVar2;
    uVar41 = (ulong)local_17c4;
    local_8c0 = auStack_14e0[uVar41 * 4];
    uStack_8b8 = auStack_14e0[uVar41 * 4 + 1];
    uStack_8b0 = auStack_14e0[uVar41 * 4 + 2];
    uStack_8a8 = *(undefined8 *)(local_14c0 + uVar41 * 0x20 + -8);
    local_8c4 = 1;
    auVar16._8_8_ = auStack_14e0[uVar41 * 4 + 1];
    auVar16._0_8_ = auStack_14e0[uVar41 * 4];
    auVar16._16_8_ = auStack_14e0[uVar41 * 4 + 2];
    auVar16._24_8_ = *(undefined8 *)(local_14c0 + uVar41 * 0x20 + -8);
    local_1340 = vpsrlq_avx2(auVar16,ZEXT416(1));
    uVar41 = (ulong)local_17c4;
    local_10c0 = auStack_14e0[uVar41 * 4];
    uStack_10b8 = auStack_14e0[uVar41 * 4 + 1];
    uStack_10b0 = auStack_14e0[uVar41 * 4 + 2];
    uStack_10a8 = *(undefined8 *)(local_14c0 + uVar41 * 0x20 + -8);
    local_10c4 = 0x3f;
    auVar3._8_8_ = auStack_14e0[uVar41 * 4 + 1];
    auVar3._0_8_ = auStack_14e0[uVar41 * 4];
    auVar3._16_8_ = auStack_14e0[uVar41 * 4 + 2];
    auVar3._24_8_ = *(undefined8 *)(local_14c0 + uVar41 * 0x20 + -8);
    auVar2 = vpsllq_avx2(auVar3,ZEXT416(0x3f));
    local_1360 = vpermq_avx2(auVar2,0x39);
    auVar2 = vpor_avx2(local_1340,local_1360);
    *(undefined1 (*) [32])(local_15e0 + (ulong)local_17c4 * 4) = auVar2;
    puVar43 = (ulong *)(in_RDI + (ulong)local_17c4 * 0x20);
    uVar41 = (ulong)local_17c4;
    uVar42 = (ulong)local_17c4;
    local_5c0 = local_1460[uVar41 * 4];
    uStack_5b8 = local_1460[uVar41 * 4 + 1];
    uStack_5b0 = local_1460[uVar41 * 4 + 2];
    uStack_5a8 = *(ulong *)(local_1440 + uVar41 * 0x20 + -8);
    local_5e0 = local_1620[uVar42 * 4];
    uStack_5d8 = local_1620[uVar42 * 4 + 1];
    uStack_5d0 = local_1620[uVar42 * 4 + 2];
    uStack_5c8 = local_1620[uVar42 * 4 + 3];
    local_640 = local_1460[uVar41 * 4] ^ local_1620[uVar42 * 4];
    uStack_638 = local_1460[uVar41 * 4 + 1] ^ local_1620[uVar42 * 4 + 1];
    uStack_630 = local_1460[uVar41 * 4 + 2] ^ local_1620[uVar42 * 4 + 2];
    uStack_628 = *(ulong *)(local_1440 + uVar41 * 0x20 + -8) ^ local_1620[uVar42 * 4 + 3];
    uVar41 = (ulong)local_17c4;
    uVar42 = (ulong)local_17c4;
    local_600 = local_15a0[uVar41 * 4];
    uStack_5f8 = local_15a0[uVar41 * 4 + 1];
    uStack_5f0 = local_15a0[uVar41 * 4 + 2];
    uStack_5e8 = local_15a0[uVar41 * 4 + 3];
    local_620 = local_15e0[uVar42 * 4];
    uStack_618 = local_15e0[uVar42 * 4 + 1];
    uStack_610 = local_15e0[uVar42 * 4 + 2];
    uStack_608 = local_15e0[uVar42 * 4 + 3];
    local_660 = local_15a0[uVar41 * 4] ^ local_15e0[uVar42 * 4];
    uStack_658 = local_15a0[uVar41 * 4 + 1] ^ local_15e0[uVar42 * 4 + 1];
    uStack_650 = local_15a0[uVar41 * 4 + 2] ^ local_15e0[uVar42 * 4 + 2];
    uStack_648 = local_15a0[uVar41 * 4 + 3] ^ local_15e0[uVar42 * 4 + 3];
    *puVar43 = local_640 ^ local_660;
    puVar43[1] = uStack_638 ^ uStack_658;
    puVar43[2] = uStack_630 ^ uStack_650;
    puVar43[3] = uStack_628 ^ uStack_648;
  }
  return;
}

Assistant:

ATTR_TARGET_AVX2
static void mpc_sbox_verify_s256_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                     const rvec_t* rvec, const word256 mask_a, const word256 mask_b,
                                     const word256 mask_c) {
  bitsliced_mm256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm256_and_verify_def(r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm256_and_verify_def(r2m, x1s, x2m, r1s, mask_c, 1);
  // c & a
  mpc_mm256_and_verify_def(r1m, x0s, x2m, r0s, mask_c, 2);

  bitsliced_mm256_step_2(SC_VERIFY);
}